

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

ProgramResourceUsage *
deqp::gles31::Functional::getCombinedProgramResourceUsage
          (ProgramResourceUsage *__return_storage_ptr__,Program *program)

{
  _Rb_tree_color _Var1;
  Shader *pSVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar11;
  int *piVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  VarType *complexType;
  int iVar18;
  Shader *pSVar19;
  pointer pVVar20;
  int iVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  long lVar24;
  uint uVar25;
  pointer pVVar26;
  long lVar27;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> bufferSizes;
  undefined1 local_ec [12];
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  Shader *local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  Program *local_78;
  long local_70;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  InstanceCounter local_38;
  
  iVar6 = -1;
  __return_storage_ptr__->uniformBufferMaxBinding = -1;
  __return_storage_ptr__->uniformBufferMaxSize = 0;
  __return_storage_ptr__->numUniformBlocks = 0;
  __return_storage_ptr__->numCombinedVertexUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedGeometryUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessControlUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessEvalUniformComponents = 0;
  __return_storage_ptr__->shaderStorageBufferMaxBinding = -1;
  __return_storage_ptr__->shaderStorageBufferMaxSize = 0;
  __return_storage_ptr__->numShaderStorageBlocks = 0;
  __return_storage_ptr__->numVaryingComponents = 0;
  __return_storage_ptr__->numVaryingVectors = 0;
  __return_storage_ptr__->numCombinedSamplers = 0;
  __return_storage_ptr__->atomicCounterBufferMaxBinding = -1;
  __return_storage_ptr__->atomicCounterBufferMaxSize = 0;
  __return_storage_ptr__->numAtomicCounterBuffers = 0;
  __return_storage_ptr__->numAtomicCounters = 0;
  __return_storage_ptr__->maxImageBinding = -1;
  __return_storage_ptr__->numCombinedImages = 0;
  __return_storage_ptr__->numCombinedOutputResources = 0;
  __return_storage_ptr__->numXFBInterleavedComponents = 0;
  __return_storage_ptr__->numXFBSeparateAttribs = 0;
  __return_storage_ptr__->numXFBSeparateComponents = 0;
  __return_storage_ptr__->fragmentOutputMaxBinding = -1;
  local_ec._4_8_ = __return_storage_ptr__;
  pvVar11 = ProgramInterfaceDefinition::Program::getShaders(program);
  if ((int)((ulong)((long)(pvVar11->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar11->
                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    local_dc = 0;
    local_d8 = 0;
    local_d4 = 0;
    local_e0 = 0;
  }
  else {
    lVar24 = 0;
    local_e0 = 0;
    local_d4 = 0;
    local_d8 = 0;
    local_dc = 0;
    local_bc = 0;
    local_c0 = 0;
    local_c4 = 0;
    local_c8 = 0;
    local_cc = 0;
    local_94 = -1;
    local_98 = 0;
    local_9c = 0;
    local_a0 = 0;
    local_a4 = -1;
    local_a8 = 0;
    local_ac = 0;
    local_b0 = 0;
    iVar9 = 0;
    local_d0 = 0;
    local_b8 = -1;
    iVar7 = 0;
    iVar8 = 0;
    local_78 = program;
    iVar5 = -1;
    do {
      local_7c = iVar5;
      local_80 = iVar9;
      pvVar11 = ProgramInterfaceDefinition::Program::getShaders(program);
      pSVar2 = (pvVar11->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar24];
      iVar5 = anon_unknown_3::getMaxBufferBinding(pSVar2,STORAGE_UNIFORM);
      uVar3 = local_ec._4_8_;
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      *(int *)local_ec._4_8_ = iVar5;
      local_84 = anon_unknown_3::getBufferMaxSize(pSVar2,STORAGE_UNIFORM);
      if (local_84 < iVar8) {
        local_84 = iVar8;
      }
      *(int *)(uVar3 + 4) = local_84;
      local_88 = anon_unknown_3::getNumShaderBlocks(pSVar2,STORAGE_UNIFORM);
      local_88 = local_88 + iVar7;
      *(int *)(uVar3 + 8) = local_88;
      switch(pSVar2->m_shaderType) {
      case SHADERTYPE_VERTEX:
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_cc = local_cc + iVar6;
        *(int *)(uVar3 + 0xc) = local_cc;
        break;
      case SHADERTYPE_FRAGMENT:
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_c8 = local_c8 + iVar6;
        *(int *)(uVar3 + 0x10) = local_c8;
        break;
      case SHADERTYPE_GEOMETRY:
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_c4 = local_c4 + iVar6;
        *(int *)(uVar3 + 0x14) = local_c4;
        break;
      case SHADERTYPE_TESSELLATION_CONTROL:
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_c0 = local_c0 + iVar6;
        *(int *)(uVar3 + 0x18) = local_c0;
        break;
      case SHADERTYPE_TESSELLATION_EVALUATION:
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_bc = local_bc + iVar6;
        *(int *)(uVar3 + 0x1c) = local_bc;
      }
      iVar6 = anon_unknown_3::getMaxBufferBinding(pSVar2,STORAGE_BUFFER);
      if (local_94 <= iVar6) {
        local_94 = iVar6;
      }
      *(int *)(uVar3 + 0x20) = local_94;
      iVar6 = anon_unknown_3::getBufferMaxSize(pSVar2,STORAGE_BUFFER);
      if (local_98 <= iVar6) {
        local_98 = iVar6;
      }
      *(int *)(uVar3 + 0x24) = local_98;
      iVar6 = anon_unknown_3::getNumShaderBlocks(pSVar2,STORAGE_BUFFER);
      local_9c = local_9c + iVar6;
      *(int *)(uVar3 + 0x28) = local_9c;
      local_b4 = iVar5;
      local_70 = lVar24;
      if (pSVar2->m_shaderType == SHADERTYPE_FRAGMENT) {
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_IN,anon_unknown_3::getNumDataTypeComponents);
        local_dc = local_dc + iVar6;
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_IN,anon_unknown_3::getNumDataTypeVectors);
        local_d4 = local_d4 + iVar6;
      }
      else if (pSVar2->m_shaderType == SHADERTYPE_VERTEX) {
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_OUT,anon_unknown_3::getNumDataTypeComponents);
        local_e0 = local_e0 + iVar6;
        iVar6 = anon_unknown_3::accumulateShaderStorage
                          (pSVar2,STORAGE_OUT,anon_unknown_3::getNumDataTypeVectors);
        local_d8 = local_d8 + iVar6;
      }
      pSVar19 = (Shader *)0x3;
      iVar6 = anon_unknown_3::getNumTypeInstances(pSVar2,STORAGE_UNIFORM,glu::isDataTypeSampler);
      local_a0 = local_a0 + iVar6;
      *(int *)(uVar3 + 0x34) = local_a0;
      pVVar20 = (pSVar2->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar26 = (pSVar2->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar25 = (int)((long)pVVar26 - (long)pVVar20 >> 5) * -0x55555555;
      local_90 = pSVar2;
      if ((int)uVar25 < 1) {
        iVar6 = -1;
      }
      else {
        uVar17 = (ulong)(uVar25 & 0x7fffffff);
        complexType = &pVVar20->varType;
        iVar6 = -1;
        do {
          bVar4 = anon_unknown_3::containsSubType(complexType,(DataType)pSVar19);
          if ((bVar4) && (iVar5 = *(int *)((long)&complexType[-2].m_data + 0xc), iVar6 <= iVar5)) {
            iVar6 = iVar5;
          }
          complexType = complexType + 4;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      if (local_a4 <= iVar6) {
        local_a4 = iVar6;
      }
      iVar6 = 0;
      *(int *)(local_ec._4_8_ + 0x38) = local_a4;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_68 + 8);
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)uVar25) {
        lVar24 = 0;
        do {
          bVar4 = anon_unknown_3::containsSubType(&pVVar20[lVar24].varType,(DataType)pSVar19);
          if (bVar4) {
            local_ec._0_4_ = pVVar20[lVar24].layout.binding;
            iVar5 = pVVar20[lVar24].layout.offset;
            local_38.m_predicate = glu::isDataTypeAtomicCounter;
            iVar7 = anon_unknown_3::
                    accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                              (&pVVar20[lVar24].varType,&local_38);
            if (iVar5 == -1) {
              iVar5 = 0;
            }
            iVar5 = iVar5 + iVar7 * 4;
            if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0066fc9d:
              pSVar19 = (Shader *)local_ec;
              piVar12 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type *)pSVar19);
            }
            else {
              p_Var14 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var23 = (_Base_ptr)((long)&local_68 + 8U);
              do {
                p_Var22 = p_Var23;
                p_Var16 = p_Var14;
                _Var1 = p_Var16[1]._M_color;
                p_Var23 = p_Var16;
                if ((int)_Var1 < (int)local_ec._0_4_) {
                  p_Var23 = p_Var22;
                }
                p_Var14 = (&p_Var16->_M_left)[(int)_Var1 < (int)local_ec._0_4_];
              } while ((&p_Var16->_M_left)[(int)_Var1 < (int)local_ec._0_4_] != (_Base_ptr)0x0);
              if (p_Var23 == (_Base_ptr)((long)&local_68 + 8U)) goto LAB_0066fc9d;
              if ((int)_Var1 < (int)local_ec._0_4_) {
                p_Var16 = p_Var22;
              }
              if ((int)local_ec._0_4_ < (int)p_Var16[1]._M_color) goto LAB_0066fc9d;
              pmVar13 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type *)local_ec);
              iVar7 = *pmVar13;
              pSVar19 = (Shader *)local_ec;
              piVar12 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type *)pSVar19);
              if (iVar5 < iVar7) {
                iVar5 = iVar7;
              }
            }
            *piVar12 = iVar5;
            pVVar20 = (local_90->m_defaultBlock).variables.
                      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar26 = (local_90->m_defaultBlock).variables.
                      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < (int)((ulong)((long)pVVar26 - (long)pVVar20) >> 5) * -0x55555555);
        if (local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
            (_Rb_tree_node_base *)((long)&local_68 + 8U)) {
          iVar6 = 0;
          p_Var14 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (iVar6 <= *(int *)&p_Var14[1].field_0x4) {
              iVar6 = *(int *)&p_Var14[1].field_0x4;
            }
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != (_Rb_tree_node_base *)((long)&local_68 + 8U));
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_68);
      pSVar2 = local_90;
      uVar3 = local_ec._4_8_;
      if (local_a8 <= iVar6) {
        local_a8 = iVar6;
      }
      *(int *)(local_ec._4_8_ + 0x3c) = local_a8;
      iVar6 = anon_unknown_3::getNumAtomicCounterBuffers((anon_unknown_3 *)local_90,pSVar19);
      local_ac = local_ac + iVar6;
      *(int *)(uVar3 + 0x40) = local_ac;
      iVar6 = anon_unknown_3::getNumTypeInstances
                        (pSVar2,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
      pSVar19 = local_90;
      local_b0 = local_b0 + iVar6;
      *(int *)(uVar3 + 0x44) = local_b0;
      pVVar20 = (pSVar2->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = -1;
      if (0 < (int)((ulong)((long)(pSVar2->m_defaultBlock).variables.
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar20) >> 5)
              * -0x55555555) {
        lVar27 = 0x20;
        lVar24 = 0;
        do {
          iVar7 = *(int *)((long)pVVar20 + lVar27 + -0x1c);
          iVar5 = iVar7 + -1;
          local_68._M_impl._0_8_ = glu::isDataTypeImage;
          iVar8 = anon_unknown_3::
                  accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                            ((VarType *)((long)&(pVVar20->layout).location + lVar27),
                             (InstanceCounter *)&local_68);
          if (iVar7 == -1) {
            iVar5 = -1;
          }
          if (iVar6 <= iVar5 + iVar8) {
            iVar6 = iVar5 + iVar8;
          }
          lVar24 = lVar24 + 1;
          pVVar20 = (pSVar19->m_defaultBlock).variables.
                    super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar27 = lVar27 + 0x60;
        } while (lVar24 < (int)((ulong)((long)(pSVar19->m_defaultBlock).variables.
                                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pVVar20) >> 5) * -0x55555555);
      }
      uVar3 = local_ec._4_8_;
      iVar5 = local_7c;
      if (local_7c <= iVar6) {
        iVar5 = iVar6;
      }
      *(int *)(local_ec._4_8_ + 0x48) = iVar5;
      iVar9 = anon_unknown_3::getNumTypeInstances(pSVar19,STORAGE_UNIFORM,glu::isDataTypeImage);
      iVar9 = local_80 + iVar9;
      *(int *)(uVar3 + 0x4c) = iVar9;
      iVar7 = anon_unknown_3::getNumTypeInstances(pSVar19,STORAGE_UNIFORM,glu::isDataTypeImage);
      iVar7 = local_d0 + iVar7;
      iVar6 = anon_unknown_3::getNumShaderBlocks(pSVar19,STORAGE_BUFFER);
      iVar6 = iVar6 + iVar7;
      *(int *)(uVar3 + 0x50) = iVar6;
      if (pSVar19->m_shaderType == SHADERTYPE_FRAGMENT) {
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar19,STORAGE_OUT,anon_unknown_3::getNumDataTypeVectors);
        *(int *)(uVar3 + 0x50) = iVar7 + iVar6;
        pVVar20 = (pSVar19->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = (int)((long)(pSVar19->m_defaultBlock).variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar20 >> 5) *
                 -0x55555555;
        if ((int)uVar25 < 1) {
          iVar8 = -1;
        }
        else {
          uVar17 = (ulong)(uVar25 & 0x7fffffff);
          piVar12 = (int *)((long)&(pVVar20->varType).m_data + 8);
          iVar8 = -1;
          do {
            if (piVar12[-6] == 1) {
              iVar18 = 1;
              if (piVar12[-4] == 1) {
                iVar18 = *piVar12;
              }
              iVar21 = piVar12[-0xc] + -1;
              if (piVar12[-0xc] == -1) {
                iVar21 = -1;
              }
              if (iVar8 <= iVar21 + iVar18) {
                iVar8 = iVar21 + iVar18;
              }
            }
            piVar12 = piVar12 + 0x18;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        if (local_b8 <= iVar8) {
          local_b8 = iVar8;
        }
        *(int *)(local_ec._4_8_ + 0x60) = local_b8;
        iVar6 = iVar7 + iVar6;
      }
      local_d0 = iVar6;
      program = local_78;
      iVar6 = local_b4;
      lVar24 = local_70 + 1;
      pvVar11 = ProgramInterfaceDefinition::Program::getShaders(local_78);
      iVar7 = local_88;
      iVar8 = local_84;
    } while (lVar24 < (int)((ulong)((long)(pvVar11->
                                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar11->
                                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  dVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
  if (dVar10 == 0x8c8c) {
    pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program);
    if ((int)((ulong)((long)(pvVar15->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar15->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      iVar6 = 0;
    }
    else {
      lVar24 = 0;
      lVar27 = 0;
      iVar6 = 0;
      do {
        pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program);
        iVar5 = anon_unknown_3::getNumFeedbackVaryingComponents
                          (program,(string *)
                                   ((long)&(((pvVar15->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar24));
        iVar6 = iVar6 + iVar5;
        lVar27 = lVar27 + 1;
        pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program);
        lVar24 = lVar24 + 0x20;
      } while (lVar27 < (int)((ulong)((long)(pvVar15->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pvVar15->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    *(int *)(local_ec._4_8_ + 0x54) = iVar6;
  }
  else {
    dVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
    uVar3 = local_ec._4_8_;
    if (dVar10 == 0x8c8d) {
      pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      *(int *)(uVar3 + 0x58) =
           (int)((ulong)((long)(pvVar15->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar15->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
      pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      if ((int)((ulong)((long)(pvVar15->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar15->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
        iVar6 = 0;
      }
      else {
        lVar24 = 0;
        lVar27 = 0;
        iVar6 = 0;
        do {
          pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                              (program);
          iVar5 = anon_unknown_3::getNumFeedbackVaryingComponents
                            (program,(string *)
                                     ((long)&(((pvVar15->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar24));
          if (iVar6 <= iVar5) {
            iVar6 = iVar5;
          }
          lVar27 = lVar27 + 1;
          pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                              (program);
          lVar24 = lVar24 + 0x20;
        } while (lVar27 < (int)((ulong)((long)(pvVar15->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar15->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 5));
      }
      *(int *)(local_ec._4_8_ + 0x5c) = iVar6;
    }
  }
  if (local_dc < local_e0) {
    local_dc = local_e0;
  }
  ((ProgramResourceUsage *)local_ec._4_8_)->numVaryingComponents = local_dc;
  if (local_d4 < local_d8) {
    local_d4 = local_d8;
  }
  ((ProgramResourceUsage *)local_ec._4_8_)->numVaryingVectors = local_d4;
  return (ProgramResourceUsage *)local_ec._4_8_;
}

Assistant:

ProgramInterfaceDefinition::ProgramResourceUsage getCombinedProgramResourceUsage (const ProgramInterfaceDefinition::Program* program)
{
	ProgramInterfaceDefinition::ProgramResourceUsage	retVal;
	int													numVertexOutputComponents	= 0;
	int													numFragmentInputComponents	= 0;
	int													numVertexOutputVectors		= 0;
	int													numFragmentInputVectors		= 0;

	retVal.uniformBufferMaxBinding					= -1; // max binding is inclusive upper bound. Allow 0 bindings by using negative value
	retVal.uniformBufferMaxSize						= 0;
	retVal.numUniformBlocks							= 0;
	retVal.numCombinedVertexUniformComponents		= 0;
	retVal.numCombinedFragmentUniformComponents		= 0;
	retVal.numCombinedGeometryUniformComponents		= 0;
	retVal.numCombinedTessControlUniformComponents	= 0;
	retVal.numCombinedTessEvalUniformComponents		= 0;
	retVal.shaderStorageBufferMaxBinding			= -1; // see above
	retVal.shaderStorageBufferMaxSize				= 0;
	retVal.numShaderStorageBlocks					= 0;
	retVal.numVaryingComponents						= 0;
	retVal.numVaryingVectors						= 0;
	retVal.numCombinedSamplers						= 0;
	retVal.atomicCounterBufferMaxBinding			= -1; // see above
	retVal.atomicCounterBufferMaxSize				= 0;
	retVal.numAtomicCounterBuffers					= 0;
	retVal.numAtomicCounters						= 0;
	retVal.maxImageBinding							= -1; // see above
	retVal.numCombinedImages						= 0;
	retVal.numCombinedOutputResources				= 0;
	retVal.numXFBInterleavedComponents				= 0;
	retVal.numXFBSeparateAttribs					= 0;
	retVal.numXFBSeparateComponents					= 0;
	retVal.fragmentOutputMaxBinding					= -1; // see above

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];

		retVal.uniformBufferMaxBinding		= de::max(retVal.uniformBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_UNIFORM));
		retVal.uniformBufferMaxSize			= de::max(retVal.uniformBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_UNIFORM));
		retVal.numUniformBlocks				+= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);

		switch (shader->getType())
		{
			case glu::SHADERTYPE_VERTEX:					retVal.numCombinedVertexUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_FRAGMENT:					retVal.numCombinedFragmentUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_GEOMETRY:					retVal.numCombinedGeometryUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_CONTROL:		retVal.numCombinedTessControlUniformComponents	+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_EVALUATION:	retVal.numCombinedTessEvalUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			default: break;
		}

		retVal.shaderStorageBufferMaxBinding	= de::max(retVal.shaderStorageBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_BUFFER));
		retVal.shaderStorageBufferMaxSize		= de::max(retVal.shaderStorageBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_BUFFER));
		retVal.numShaderStorageBlocks			+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_VERTEX)
		{
			numVertexOutputComponents	+= getNumComponents(shader, glu::STORAGE_OUT);
			numVertexOutputVectors		+= getNumVectors(shader, glu::STORAGE_OUT);
		}
		else if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			numFragmentInputComponents	+= getNumComponents(shader, glu::STORAGE_IN);
			numFragmentInputVectors		+= getNumVectors(shader, glu::STORAGE_IN);
		}

		retVal.numCombinedSamplers	+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);

		retVal.atomicCounterBufferMaxBinding	= de::max(retVal.atomicCounterBufferMaxBinding, getAtomicCounterMaxBinding(shader));
		retVal.atomicCounterBufferMaxSize		= de::max(retVal.atomicCounterBufferMaxSize, getAtomicCounterMaxBufferSize(shader));
		retVal.numAtomicCounterBuffers			+= getNumAtomicCounterBuffers(shader);
		retVal.numAtomicCounters				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);
		retVal.maxImageBinding					= de::max(retVal.maxImageBinding, getUniformMaxBinding(shader, glu::isDataTypeImage));
		retVal.numCombinedImages				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

		retVal.numCombinedOutputResources		+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);
		retVal.numCombinedOutputResources		+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			retVal.numCombinedOutputResources += getNumVectors(shader, glu::STORAGE_OUT);
			retVal.fragmentOutputMaxBinding = de::max(retVal.fragmentOutputMaxBinding, getFragmentOutputMaxLocation(shader));
		}
	}

	if (program->getTransformFeedbackMode() == GL_INTERLEAVED_ATTRIBS)
		retVal.numXFBInterleavedComponents = getNumXFBComponents(program);
	else if (program->getTransformFeedbackMode() == GL_SEPARATE_ATTRIBS)
	{
		retVal.numXFBSeparateAttribs	= (int)program->getTransformFeedbackVaryings().size();
		retVal.numXFBSeparateComponents	= getNumMaxXFBOutputComponents(program);
	}

	// legacy limits
	retVal.numVaryingComponents	= de::max(numVertexOutputComponents, numFragmentInputComponents);
	retVal.numVaryingVectors	= de::max(numVertexOutputVectors, numFragmentInputVectors);

	return retVal;
}